

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

optional<cmSwiftCompileMode> __thiscall
cmLocalGenerator::GetSwiftCompileMode
          (cmLocalGenerator *this,cmGeneratorTarget *target,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  int iVar3;
  cmValue cVar4;
  cmValue cVar5;
  ulong uVar6;
  ulong uVar7;
  string expandedCompileMode;
  string local_70;
  string local_50;
  
  this_00 = this->Makefile;
  paVar1 = &expandedCompileMode.field_2;
  expandedCompileMode._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&expandedCompileMode,"CMAKE_Swift_COMPILATION_MODE_DEFAULT","");
  cVar4 = cmMakefile::GetDefinition(this_00,&expandedCompileMode);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expandedCompileMode._M_dataplus._M_p != paVar1) {
    operator_delete(expandedCompileMode._M_dataplus._M_p,
                    expandedCompileMode.field_2._M_allocated_capacity + 1);
  }
  if ((cVar4.Value == (string *)0x0) || ((cVar4.Value)->_M_string_length == 0)) {
    uVar7 = 0;
    uVar6 = 0;
  }
  else {
    expandedCompileMode._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&expandedCompileMode,"Swift_COMPILATION_MODE","");
    cVar5 = cmGeneratorTarget::GetProperty(target,&expandedCompileMode);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)expandedCompileMode._M_dataplus._M_p != paVar1) {
      operator_delete(expandedCompileMode._M_dataplus._M_p,
                      expandedCompileMode.field_2._M_allocated_capacity + 1);
    }
    if (cVar5.Value != (string *)0x0) {
      cVar4 = cVar5;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar2 = ((cVar4.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + (cVar4.Value)->_M_string_length);
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    cmGeneratorExpression::Evaluate
              (&expandedCompileMode,&local_70,this,config,target,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    iVar3 = std::__cxx11::string::compare((char *)&expandedCompileMode);
    if (iVar3 == 0) {
      uVar7 = 0;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&expandedCompileMode);
      if (iVar3 == 0) {
        uVar7 = 2;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&expandedCompileMode);
        uVar7 = (ulong)(iVar3 != 0) * 2 + 1;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)expandedCompileMode._M_dataplus._M_p != paVar1) {
      operator_delete(expandedCompileMode._M_dataplus._M_p,
                      expandedCompileMode.field_2._M_allocated_capacity + 1);
    }
    uVar6 = 0x100000000;
  }
  return (_Optional_base<cmSwiftCompileMode,_true,_true>)
         (_Optional_base<cmSwiftCompileMode,_true,_true>)(uVar7 | uVar6);
}

Assistant:

cm::optional<cmSwiftCompileMode> cmLocalGenerator::GetSwiftCompileMode(
  cmGeneratorTarget const* target, std::string const& config)
{
  cmMakefile const* mf = this->GetMakefile();
  cmValue const swiftCompileModeDefault =
    mf->GetDefinition("CMAKE_Swift_COMPILATION_MODE_DEFAULT");
  if (!cmNonempty(swiftCompileModeDefault)) {
    return {};
  }
  cmValue swiftCompileMode = target->GetProperty("Swift_COMPILATION_MODE");
  if (!swiftCompileMode) {
    swiftCompileMode = swiftCompileModeDefault;
  }

  std::string const expandedCompileMode =
    cmGeneratorExpression::Evaluate(*swiftCompileMode, this, config, target);
  if (expandedCompileMode == "wholemodule") {
    return cmSwiftCompileMode::Wholemodule;
  }
  if (expandedCompileMode == "singlefile") {
    return cmSwiftCompileMode::Singlefile;
  }
  if (expandedCompileMode == "incremental") {
    return cmSwiftCompileMode::Incremental;
  }
  return cmSwiftCompileMode::Unknown;
}